

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall CConnman::SetNetworkActive(CConnman *this,bool active)

{
  string_view source_file;
  atomic<bool> aVar1;
  bool bVar2;
  byte in_SIL;
  long in_RDI;
  long in_FS_OFFSET;
  ConstevalFormatString<2U> in_stack_00000038;
  char *in_stack_00000048;
  string_view in_stack_00000050;
  Level in_stack_00000130;
  char (*in_stack_00000140) [17];
  bool *in_stack_00000148;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffffa0;
  atomic<bool> *this_00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa8;
  undefined7 in_stack_fffffffffffffff0;
  long lVar4;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  aVar1._M_base._M_i = (__atomic_base<bool>)(in_SIL & 1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  this_00 = (atomic<bool> *)&stack0xfffffffffffffff7;
  uVar3 = 2;
  source_file._M_str = in_stack_00000048;
  source_file._M_len = (size_t)this;
  LogPrintFormatInternal<char[17],bool>
            (in_stack_00000050,source_file,(int)((ulong)lVar4 >> 0x20),
             CONCAT17(aVar1._M_base._M_i,in_stack_fffffffffffffff0),in_stack_00000130,
             in_stack_00000038,in_stack_00000140,in_stack_00000148);
  bVar2 = std::atomic::operator_cast_to_bool(this_00);
  if ((bVar2 != (bool)((byte)aVar1._M_base._M_i & 1)) &&
     (std::atomic<bool>::operator=((atomic<bool> *)CONCAT44(in_stack_ffffffffffffff8c,uVar3),false),
     *(long *)(in_RDI + 0x260) != 0)) {
    std::atomic::operator_cast_to_bool(this_00);
    CClientUIInterface::NotifyNetworkActiveChanged
              ((CClientUIInterface *)CONCAT44(in_stack_ffffffffffffff8c,uVar3),false);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::SetNetworkActive(bool active)
{
    LogPrintf("%s: %s\n", __func__, active);

    if (fNetworkActive == active) {
        return;
    }

    fNetworkActive = active;

    if (m_client_interface) {
        m_client_interface->NotifyNetworkActiveChanged(fNetworkActive);
    }
}